

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderConstExprTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderConstExprTests::init(ShaderConstExprTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  TestNode *node;
  long lVar3;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_48;
  ShaderLibrary local_30;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            (&local_30,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile(&local_48,&local_30,"shaders/constant_expressions.test");
  deqp::gls::ShaderLibrary::~ShaderLibrary(&local_30);
  if (0 < (int)((ulong)((long)local_48.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar3 = 0;
    do {
      tcu::TestNode::addChild
                ((TestNode *)this,
                 local_48.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)((long)local_48.
                                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.
                                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  node = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar1->m_testCtx,"builtin_functions","Builtin functions");
  node[1]._vptr_TestNode = (_func_int **)pCVar1;
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211f3d0;
  tcu::TestNode::addChild((TestNode *)this,node);
  iVar2 = extraout_EAX;
  if (local_48.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void ShaderConstExprTests::init (void)
{
	const std::vector<tcu::TestNode*> children = gls::ShaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo()).loadShaderFile("shaders/constant_expressions.test");

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);

	addChild(new ShaderConstExprBuiltinTests(m_context));
}